

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O3

offset_t __thiscall lattice::supercell::lcord2offset(supercell *this,size_t lc)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  undefined8 *puVar6;
  ulong in_RDX;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  offset_t oVar10;
  
  this->dim_ = 0;
  this->num_cells_ = 0;
  uVar1 = *(ulong *)lc;
  if (uVar1 == 0) {
    this->num_cells_ = 0;
  }
  else {
    if ((long)uVar1 < 1) {
      pvVar5 = (void *)0x0;
    }
    else {
      if (uVar1 >> 0x3d != 0) {
LAB_0010c92f:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = dup2;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pvVar5 = malloc(uVar1 * 8);
      if (pvVar5 == (void *)0x0) goto LAB_0010c92f;
    }
    this->dim_ = (size_t)pvVar5;
    this->num_cells_ = uVar1;
    lVar2 = *(long *)(lc + 0x50);
    uVar1 = *(ulong *)lc;
    lVar3 = *(long *)(lc + 0x40);
    uVar7 = 0;
    uVar9 = in_RDX;
    do {
      lVar4 = *(long *)(lVar3 + uVar7 * 8);
      *(ulong *)((long)pvVar5 + uVar7 * 8) =
           uVar9 % (ulong)(*(long *)(lVar2 + uVar7 * 8) - lVar4) + lVar4;
      uVar8 = *(long *)(lVar2 + uVar7 * 8) - *(long *)(lVar3 + uVar7 * 8);
      in_RDX = uVar9 % uVar8;
      uVar7 = uVar7 + 1;
      uVar9 = uVar9 / uVar8;
    } while (uVar7 < uVar1);
  }
  oVar10.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows = in_RDX;
  oVar10.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (long *)this;
  return (offset_t)oVar10.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

offset_t lcord2offset(std::size_t lc) const {
    offset_t c(dim_);
    for (std::size_t m = 0; m < dim_; ++m) {
      c(m) = (lc % (nmax_(m) - nmin_(m))) + nmin_(m);
      lc /= (nmax_(m) - nmin_(m));
    }
    return c;
  }